

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schedule.hpp
# Opt level: O0

bool __thiscall Common::check(Common *this,TaskHandle *head)

{
  bool bVar1;
  element_type *peVar2;
  reference pOVar3;
  __shared_ptr_access<Operand,_(__gnu_cxx::_Lock_policy)2,_false,_false> *p_Var4;
  element_type *peVar5;
  size_type sVar6;
  shared_ptr<Operand> *operand_2;
  const_iterator __end1_2;
  const_iterator __begin1_2;
  vector<std::shared_ptr<Operand>,_std::allocator<std::shared_ptr<Operand>_>_> *__range1_2;
  OperandUsage *usage_2;
  iterator __end3_2;
  iterator __begin3_2;
  vector<OperandUsage,_std::allocator<OperandUsage>_> *__range3_2;
  OperandUsage *usage_1;
  iterator __end3_1;
  iterator __begin3_1;
  vector<OperandUsage,_std::allocator<OperandUsage>_> *__range3_1;
  OperandUsage *usage;
  iterator __end3;
  iterator __begin3;
  vector<OperandUsage,_std::allocator<OperandUsage>_> *__range3;
  undefined1 local_70 [8];
  TaskHandle task;
  shared_ptr<Operand> *operand_1;
  iterator __end1_1;
  iterator __begin1_1;
  set<std::shared_ptr<Operand>,_std::less<std::shared_ptr<Operand>_>,_std::allocator<std::shared_ptr<Operand>_>_>
  *__range1_1;
  shared_ptr<Operand> *operand;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::shared_ptr<Operand>,_std::allocator<std::shared_ptr<Operand>_>_> *__range1;
  TaskHandle *head_local;
  Common *this_local;
  
  __end1 = std::vector<std::shared_ptr<Operand>,_std::allocator<std::shared_ptr<Operand>_>_>::begin
                     (&this->operands);
  operand = (shared_ptr<Operand> *)
            std::vector<std::shared_ptr<Operand>,_std::allocator<std::shared_ptr<Operand>_>_>::end
                      (&this->operands);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<const_std::shared_ptr<Operand>_*,_std::vector<std::shared_ptr<Operand>,_std::allocator<std::shared_ptr<Operand>_>_>_>
                                     *)&operand), bVar1) {
    p_Var4 = (__shared_ptr_access<Operand,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             __gnu_cxx::
             __normal_iterator<const_std::shared_ptr<Operand>_*,_std::vector<std::shared_ptr<Operand>,_std::allocator<std::shared_ptr<Operand>_>_>_>
             ::operator*(&__end1);
    peVar5 = std::__shared_ptr_access<Operand,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       (p_Var4);
    Operand::clear(peVar5);
    __gnu_cxx::
    __normal_iterator<const_std::shared_ptr<Operand>_*,_std::vector<std::shared_ptr<Operand>,_std::allocator<std::shared_ptr<Operand>_>_>_>
    ::operator++(&__end1);
  }
  __end1_1 = std::
             set<std::shared_ptr<Operand>,_std::less<std::shared_ptr<Operand>_>,_std::allocator<std::shared_ptr<Operand>_>_>
             ::begin(&this->already_on);
  operand_1 = (shared_ptr<Operand> *)
              std::
              set<std::shared_ptr<Operand>,_std::less<std::shared_ptr<Operand>_>,_std::allocator<std::shared_ptr<Operand>_>_>
              ::end(&this->already_on);
  while (bVar1 = std::operator!=(&__end1_1,(_Self *)&operand_1), bVar1) {
    task.super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         std::_Rb_tree_const_iterator<std::shared_ptr<Operand>_>::operator*(&__end1_1);
    peVar5 = std::__shared_ptr_access<Operand,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<Operand,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        task.super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
    ;
    peVar5->on_device = true;
    std::_Rb_tree_const_iterator<std::shared_ptr<Operand>_>::operator++(&__end1_1);
  }
  std::shared_ptr<Task>::shared_ptr((shared_ptr<Task> *)local_70,head);
  while (bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_70), bVar1) {
    peVar2 = std::__shared_ptr_access<Task,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<Task,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        local_70);
    bVar1 = Task::isDealloc(peVar2);
    if (bVar1) {
      peVar2 = std::__shared_ptr_access<Task,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                         ((__shared_ptr_access<Task,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                          local_70);
      __end3 = std::vector<OperandUsage,_std::allocator<OperandUsage>_>::begin(&peVar2->outs);
      usage = (OperandUsage *)
              std::vector<OperandUsage,_std::allocator<OperandUsage>_>::end(&peVar2->outs);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end3,(__normal_iterator<OperandUsage_*,_std::vector<OperandUsage,_std::allocator<OperandUsage>_>_>
                                         *)&usage), bVar1) {
        pOVar3 = __gnu_cxx::
                 __normal_iterator<OperandUsage_*,_std::vector<OperandUsage,_std::allocator<OperandUsage>_>_>
                 ::operator*(&__end3);
        peVar5 = std::__shared_ptr_access<Operand,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<Operand,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)pOVar3);
        if ((peVar5->on_device & 1U) == 0) {
          peVar5 = std::__shared_ptr_access<Operand,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<Operand,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)pOVar3);
          error("Operand %d not on device (.dealloc)\n",(ulong)(uint)peVar5->id);
          this_local._7_1_ = 0;
          __range3._4_4_ = 1;
          goto LAB_0017bd14;
        }
        peVar5 = std::__shared_ptr_access<Operand,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<Operand,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)pOVar3);
        peVar5->on_device = false;
        __gnu_cxx::
        __normal_iterator<OperandUsage_*,_std::vector<OperandUsage,_std::allocator<OperandUsage>_>_>
        ::operator++(&__end3);
      }
    }
    else {
      peVar2 = std::__shared_ptr_access<Task,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                         ((__shared_ptr_access<Task,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                          local_70);
      __end3_1 = std::vector<OperandUsage,_std::allocator<OperandUsage>_>::begin(&peVar2->ins);
      usage_1 = (OperandUsage *)
                std::vector<OperandUsage,_std::allocator<OperandUsage>_>::end(&peVar2->ins);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end3_1,
                                (__normal_iterator<OperandUsage_*,_std::vector<OperandUsage,_std::allocator<OperandUsage>_>_>
                                 *)&usage_1), bVar1) {
        pOVar3 = __gnu_cxx::
                 __normal_iterator<OperandUsage_*,_std::vector<OperandUsage,_std::allocator<OperandUsage>_>_>
                 ::operator*(&__end3_1);
        peVar5 = std::__shared_ptr_access<Operand,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<Operand,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)pOVar3);
        if ((peVar5->on_device & 1U) == 0) {
          peVar5 = std::__shared_ptr_access<Operand,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<Operand,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)pOVar3);
          error("Operand %d not on device (normal operators)\n",(ulong)(uint)peVar5->id);
          this_local._7_1_ = 0;
          __range3._4_4_ = 1;
          goto LAB_0017bd14;
        }
        __gnu_cxx::
        __normal_iterator<OperandUsage_*,_std::vector<OperandUsage,_std::allocator<OperandUsage>_>_>
        ::operator++(&__end3_1);
      }
      peVar2 = std::__shared_ptr_access<Task,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                         ((__shared_ptr_access<Task,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                          local_70);
      __end3_2 = std::vector<OperandUsage,_std::allocator<OperandUsage>_>::begin(&peVar2->outs);
      usage_2 = (OperandUsage *)
                std::vector<OperandUsage,_std::allocator<OperandUsage>_>::end(&peVar2->outs);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end3_2,
                                (__normal_iterator<OperandUsage_*,_std::vector<OperandUsage,_std::allocator<OperandUsage>_>_>
                                 *)&usage_2), bVar1) {
        pOVar3 = __gnu_cxx::
                 __normal_iterator<OperandUsage_*,_std::vector<OperandUsage,_std::allocator<OperandUsage>_>_>
                 ::operator*(&__end3_2);
        peVar5 = std::__shared_ptr_access<Operand,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<Operand,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)pOVar3);
        peVar5->on_device = true;
        __gnu_cxx::
        __normal_iterator<OperandUsage_*,_std::vector<OperandUsage,_std::allocator<OperandUsage>_>_>
        ::operator++(&__end3_2);
      }
    }
    peVar2 = std::__shared_ptr_access<Task,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<Task,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        local_70);
    std::shared_ptr<Task>::operator=((shared_ptr<Task> *)local_70,&peVar2->next);
  }
  __range3._4_4_ = 6;
LAB_0017bd14:
  std::shared_ptr<Task>::~shared_ptr((shared_ptr<Task> *)local_70);
  if (__range3._4_4_ != 1) {
    __end1_2 = std::vector<std::shared_ptr<Operand>,_std::allocator<std::shared_ptr<Operand>_>_>::
               begin(&this->operands);
    operand_2 = (shared_ptr<Operand> *)
                std::vector<std::shared_ptr<Operand>,_std::allocator<std::shared_ptr<Operand>_>_>::
                end(&this->operands);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end1_2,
                              (__normal_iterator<const_std::shared_ptr<Operand>_*,_std::vector<std::shared_ptr<Operand>,_std::allocator<std::shared_ptr<Operand>_>_>_>
                               *)&operand_2), bVar1) {
      p_Var4 = (__shared_ptr_access<Operand,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               __gnu_cxx::
               __normal_iterator<const_std::shared_ptr<Operand>_*,_std::vector<std::shared_ptr<Operand>,_std::allocator<std::shared_ptr<Operand>_>_>_>
               ::operator*(&__end1_2);
      peVar5 = std::__shared_ptr_access<Operand,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->(p_Var4);
      if (((peVar5->on_device & 1U) != 0) &&
         (sVar6 = std::
                  set<std::shared_ptr<Operand>,_std::less<std::shared_ptr<Operand>_>,_std::allocator<std::shared_ptr<Operand>_>_>
                  ::count(&this->not_dealloc,(key_type *)p_Var4), sVar6 == 0)) {
        peVar5 = std::__shared_ptr_access<Operand,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->(p_Var4);
        error("Forget to dealloc %d\n",(ulong)(uint)peVar5->id);
        this_local._7_1_ = 0;
        goto LAB_0017be49;
      }
      peVar5 = std::__shared_ptr_access<Operand,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->(p_Var4);
      if (((peVar5->on_device & 1U) == 0) &&
         (sVar6 = std::
                  set<std::shared_ptr<Operand>,_std::less<std::shared_ptr<Operand>_>,_std::allocator<std::shared_ptr<Operand>_>_>
                  ::count(&this->not_dealloc,(key_type *)p_Var4), sVar6 != 0)) {
        peVar5 = std::__shared_ptr_access<Operand,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->(p_Var4);
        error("Operand %d has been dealloc but should not\n",(ulong)(uint)peVar5->id);
        this_local._7_1_ = 0;
        goto LAB_0017be49;
      }
      __gnu_cxx::
      __normal_iterator<const_std::shared_ptr<Operand>_*,_std::vector<std::shared_ptr<Operand>,_std::allocator<std::shared_ptr<Operand>_>_>_>
      ::operator++(&__end1_2);
    }
    this_local._7_1_ = 1;
  }
LAB_0017be49:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool check(TaskHandle &head) const {
        // Clear status
        for (auto &operand: operands) {
            operand->clear();
        }
        for (auto &operand: already_on) {
            operand->on_device = true;
        }

        // Simulate and check
        LOOP(task, head) {
            if (task->isDealloc()) {
                for (auto &usage: task->outs) {
                    if (not usage.operand->on_device) {
                        error("Operand %d not on device (.dealloc)\n", usage.operand->id);
                        return false;
                    }
                    usage.operand->on_device = false;
                }
            } else {
                for (auto &usage: task->ins) {
                    if (not usage.operand->on_device) {
                        error("Operand %d not on device (normal operators)\n", usage.operand->id);
                        return false;
                    }
                }
                for (auto &usage: task->outs) {
                    usage.operand->on_device = true;
                }
            }
        }

        // Check final status
        for (auto &operand: operands) {
            if (operand->on_device and not not_dealloc.count(operand)) {
                error("Forget to dealloc %d\n", operand->id);
                return false;
            }
            if (not operand->on_device and not_dealloc.count(operand)) {
                error("Operand %d has been dealloc but should not\n", operand->id);
                return false;
            }
        }
        return true;
    }